

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# last.cpp
# Opt level: O0

void copy_test(bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  polymorphic_allocator<std::byte> local_178;
  undefined1 local_170 [8];
  pstring string3;
  undefined1 local_150 [8];
  pstring string2;
  undefined1 local_130 [8];
  pstring astring;
  undefined1 local_108 [8];
  test_resource tpmr;
  Framer framer;
  bool verbose_local;
  
  Framer::Framer((Framer *)&tpmr.m_pmr_,"copy constructor test",verbose);
  std::pmr::test_resource::test_resource((test_resource *)local_108,"object",verbose);
  std::pmr::test_resource::set_no_abort((test_resource *)local_108,true);
  std::pmr::polymorphic_allocator_P0339R5<std::byte>::polymorphic_allocator
            ((polymorphic_allocator_P0339R5<std::byte> *)&string2.m_buffer_,
             (memory_resource *)local_108);
  pstring::pstring((pstring *)local_130,"barfool",(allocator_type)string2.m_buffer_);
  std::pmr::polymorphic_allocator_P0339R5<std::byte>::polymorphic_allocator
            ((polymorphic_allocator_P0339R5<std::byte> *)&string3.m_buffer_,
             (memory_resource *)local_108);
  pstring::pstring((pstring *)local_150,(pstring *)local_130,(allocator_type)string3.m_buffer_);
  local_178._M_resource = (memory_resource *)0x0;
  std::pmr::polymorphic_allocator_P0339R5<std::byte>::polymorphic_allocator_P0339R5
            ((polymorphic_allocator_P0339R5<std::byte> *)&local_178);
  pstring::pstring((pstring *)local_170,(pstring *)local_130,(allocator_type)local_178._M_resource);
  pstring::str_abi_cxx11_(&local_198,(pstring *)local_130);
  bVar1 = std::operator!=(&local_198,"barfool");
  std::__cxx11::string::~string((string *)&local_198);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"astring.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&local_1b8,(pstring *)local_130);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_1b8);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_1b8);
    errorCount = errorCount + 1;
  }
  pstring::str_abi_cxx11_(&local_1d8,(pstring *)local_150);
  bVar1 = std::operator!=(&local_1d8,"barfool");
  std::__cxx11::string::~string((string *)&local_1d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"string2.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&local_1f8,(pstring *)local_150);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_1f8);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_1f8);
    errorCount = errorCount + 1;
  }
  pstring::str_abi_cxx11_(&local_218,(pstring *)local_170);
  bVar1 = std::operator!=(&local_218,"barfool");
  std::__cxx11::string::~string((string *)&local_218);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"string3.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&local_238,(pstring *)local_170);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_238);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_238);
    errorCount = errorCount + 1;
  }
  pstring::~pstring((pstring *)local_170);
  pstring::~pstring((pstring *)local_150);
  pstring::~pstring((pstring *)local_130);
  std::pmr::test_resource::~test_resource((test_resource *)local_108);
  Framer::~Framer((Framer *)&tpmr.m_pmr_);
  return;
}

Assistant:

void copy_test(bool verbose)
{
    Framer framer{ "copy constructor test", verbose };

    std::pmr::test_resource tpmr{ "object", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };
    pstring string2{ astring, &tpmr };
    pstring string3{ astring };

    ASSERT_EQ(astring.str(), "barfool");
    ASSERT_EQ(string2.str(), "barfool");
    ASSERT_EQ(string3.str(), "barfool");
}